

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  float *pfVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  float *pfVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ImGuiWindow *window;
  ImVec2 IVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  fVar14 = (pIVar3->DC).ItemWidth;
  if (fVar14 < 0.0) {
    IVar12 = ImGui::GetContentRegionAvail();
    fVar13 = fVar14 + IVar12.x;
    fVar14 = 1.0;
    if (1.0 <= fVar13) {
      fVar14 = fVar13;
    }
  }
  pIVar6 = GImGui;
  iVar10 = components + -1;
  fVar13 = (pIVar5->Style).ItemInnerSpacing.x;
  fVar15 = (float)(int)(((float)(int)fVar14 - fVar13 * (float)iVar10) / (float)components);
  fVar16 = 1.0;
  if (1.0 <= fVar15) {
    fVar16 = fVar15;
  }
  fVar13 = (float)(int)((float)(int)fVar14 - (fVar13 + fVar16) * (float)iVar10);
  fVar14 = 1.0;
  if (1.0 <= fVar13) {
    fVar14 = fVar13;
  }
  iVar11 = (pIVar3->DC).ItemWidthStack.Size;
  iVar2 = (pIVar3->DC).ItemWidthStack.Capacity;
  if (iVar11 == iVar2) {
    iVar11 = iVar11 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar11 < iVar9) {
      iVar11 = iVar9;
    }
    if (iVar2 < iVar11) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pfVar7 = (float *)(*(pIVar6->IO).MemAllocFn)((long)iVar11 << 2);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if (pfVar4 != (float *)0x0) {
        memcpy(pfVar7,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
      }
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if (pfVar4 != (float *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pfVar4);
      (pIVar3->DC).ItemWidthStack.Data = pfVar7;
      (pIVar3->DC).ItemWidthStack.Capacity = iVar11;
    }
  }
  pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
  iVar11 = (pIVar3->DC).ItemWidthStack.Size;
  (pIVar3->DC).ItemWidthStack.Size = iVar11 + 1;
  pfVar4[iVar11] = fVar14;
  if (1 < components) {
    do {
      pIVar5 = GImGui;
      iVar11 = (pIVar3->DC).ItemWidthStack.Size;
      iVar2 = (pIVar3->DC).ItemWidthStack.Capacity;
      if (iVar11 == iVar2) {
        if (iVar2 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar2 / 2 + iVar2;
        }
        iVar11 = iVar11 + 1;
        if (iVar11 < iVar9) {
          iVar11 = iVar9;
        }
        if (iVar2 < iVar11) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pfVar7 = (float *)(*(pIVar5->IO).MemAllocFn)((long)iVar11 << 2);
          pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
          if (pfVar4 != (float *)0x0) {
            memcpy(pfVar7,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
          }
          pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
          if (pfVar4 != (float *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pfVar4);
          (pIVar3->DC).ItemWidthStack.Data = pfVar7;
          (pIVar3->DC).ItemWidthStack.Capacity = iVar11;
        }
      }
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      iVar11 = (pIVar3->DC).ItemWidthStack.Size;
      (pIVar3->DC).ItemWidthStack.Size = iVar11 + 1;
      pfVar4[iVar11] = fVar16;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  lVar8 = (long)(pIVar3->DC).ItemWidthStack.Size;
  if (lVar8 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                  ,0x365,"value_type &ImVector<float>::back() [T = float]");
  }
  (pIVar3->DC).ItemWidth = (pIVar3->DC).ItemWidthStack.Data[lVar8 + -1];
  return;
}

Assistant:

static void PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = ImGui::CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}